

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O1

InfogainLossParameter * __thiscall
caffe::V1LayerParameter::mutable_infogain_loss_param(V1LayerParameter *this)

{
  byte *pbVar1;
  InfogainLossParameter *this_00;
  
  pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
  *pbVar1 = *pbVar1 | 2;
  if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
    this_00 = (InfogainLossParameter *)operator_new(0x20);
    InfogainLossParameter::InfogainLossParameter(this_00);
    this->infogain_loss_param_ = this_00;
  }
  return this->infogain_loss_param_;
}

Assistant:

inline ::caffe::InfogainLossParameter* V1LayerParameter::mutable_infogain_loss_param() {
  set_has_infogain_loss_param();
  if (infogain_loss_param_ == NULL) {
    infogain_loss_param_ = new ::caffe::InfogainLossParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.infogain_loss_param)
  return infogain_loss_param_;
}